

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

size_t __thiscall TestRange<unsigned_long>::getSteps(TestRange<unsigned_long> *this)

{
  RangeType RVar1;
  size_t sVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  RVar1 = this->type;
  if (RVar1 == EXPONENTIAL) {
    dVar4 = log((double)((long)this->end / (long)this->begin));
    dVar5 = log(((double)CONCAT44(0x45300000,(int)(this->step >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)this->step) - 4503599627370496.0));
    dVar4 = dVar4 / dVar5 + 1.0;
    uVar3 = (ulong)dVar4;
    sVar2 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  else if (RVar1 == LINEAR) {
    sVar2 = (this->end - this->begin) / this->step + 1;
  }
  else if (RVar1 == ARRAY) {
    sVar2 = (long)(this->array).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->array).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t getSteps() {
        if (type == RangeType::ARRAY) {
            return array.size();
        } else if (type == RangeType::LINEAR) {
            return ((end - begin) / step) + 1;
        } else if (type == RangeType::EXPONENTIAL) {
            ssize_t coe = ((ssize_t)end) / ((ssize_t)begin);
            double steps_double = (double)std::log(coe) / std::log(step);
            return (size_t)(steps_double + 1);
        }

        return 0;
    }